

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O2

void banksia::TourMng::append2TextFile(string *path,string *str)

{
  ostream *poVar1;
  ofstream ofs;
  
  std::ofstream::ofstream((ostream *)&ofs,(string *)path,_S_out|_S_app);
  poVar1 = std::operator<<((ostream *)&ofs,(string *)str);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void TourMng::append2TextFile(const std::string& path, const std::string& str)
{
    std::ofstream ofs(path, std::ios_base::out | std::ios_base::app);
    ofs << str << std::endl;
    ofs.close();
}